

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

UMutableCPTrie * umutablecptrie_clone_63(UMutableCPTrie *other,UErrorCode *pErrorCode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  MutableCodePointTrie *pMVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  MutableCodePointTrie *p;
  MutableCodePointTrie *pMVar7;
  uint uVar8;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> clone;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_30;
  
  if (other == (UMutableCPTrie *)0x0) {
    return (UMutableCPTrie *)0x0;
  }
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  pMVar4 = (MutableCodePointTrie *)
           icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
  if (pMVar4 != (MutableCodePointTrie *)0x0) {
    pMVar4->index = (uint32_t *)0x0;
    pMVar4->indexCapacity = 0;
    pMVar4->index3NullOffset = *(int32_t *)(other + 0xc);
    pMVar4->data = (uint32_t *)0x0;
    pMVar4->dataCapacity = 0;
    pMVar4->dataLength = 0;
    uVar1 = *(undefined8 *)(other + 0x20);
    uVar2 = *(undefined8 *)(other + 0x28);
    pMVar4->dataNullOffset = (int)uVar1;
    pMVar4->origInitialValue = (int)((ulong)uVar1 >> 0x20);
    pMVar4->initialValue = (int)uVar2;
    pMVar4->errorValue = (int)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined8 *)(other + 0x30);
    pMVar4->highStart = (int)uVar1;
    pMVar4->highValue = (int)((ulong)uVar1 >> 0x20);
    pMVar4->index16 = (uint16_t *)0x0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar8 = (uint)(0x10000 < (int)uVar1);
      puVar5 = (uint32_t *)uprv_malloc_63((ulong)(uVar8 * 0x40000 + 0x4000));
      pMVar4->index = puVar5;
      puVar6 = (uint32_t *)uprv_malloc_63((long)*(int *)(other + 0x18) << 2);
      pMVar4->data = puVar6;
      puVar5 = pMVar4->index;
      if ((puVar5 == (uint32_t *)0x0) || (puVar6 == (uint32_t *)0x0)) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        pMVar4->indexCapacity = uVar8 * 0x10000 | 0x1000;
        pMVar4->dataCapacity = *(int32_t *)(other + 0x18);
        iVar3 = pMVar4->highStart >> 4;
        memcpy(pMVar4->flags,other + 0x40,(long)iVar3);
        memcpy(puVar5,*(void **)other,(long)(iVar3 << 2));
        memcpy(pMVar4->data,*(void **)(other + 0x10),(long)*(int *)(other + 0x1c) << 2);
        pMVar4->dataLength = *(int32_t *)(other + 0x1c);
      }
    }
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR && pMVar4 == (MutableCodePointTrie *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_30.ptr = (MutableCodePointTrie *)0x0;
    pMVar7 = pMVar4;
    goto LAB_002ab64e;
  }
  pMVar7 = (MutableCodePointTrie *)0x0;
  local_30.ptr = pMVar4;
LAB_002ab64e:
  icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            ((LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> *)&local_30);
  return (UMutableCPTrie *)pMVar7;
}

Assistant:

U_CAPI UMutableCPTrie * U_EXPORT2
umutablecptrie_clone(const UMutableCPTrie *other, UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    if (other == nullptr) {
        return nullptr;
    }
    LocalPointer<MutableCodePointTrie> clone(
        new MutableCodePointTrie(*reinterpret_cast<const MutableCodePointTrie *>(other), *pErrorCode), *pErrorCode);
    if (U_FAILURE(*pErrorCode)) {
        return nullptr;
    }
    return reinterpret_cast<UMutableCPTrie *>(clone.orphan());
}